

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvp_fe_tests.cc
# Opt level: O0

vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> * __thiscall
lf::uscalfe::test::
TestConvergenceEllBVPFESol<lf::mesh::utils::MeshFunctionGlobal<lf::uscalfe::test::lfe_bvpfe_bvp_demo_Test::TestBody()::__0>,lf::mesh::utils::MeshFunctionGlobal<lf::uscalfe::test::lfe_bvpfe_bvp_demo_Test::TestBody()::__1>>
          (vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
           *__return_storage_ptr__,test *this,int reflevels,
          shared_ptr<const_lf::uscalfe::test::SecondOrderEllipticBVP<double>_> *bvp_p,
          MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_uscalfe_test_bvp_fe_tests_cc:302:7)>
          *solution,
          MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_uscalfe_test_bvp_fe_tests_cc:304:7)>
          *sol_grad,int meshsel,double scal)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *__r;
  MeshFunctionReturnType<lf::mesh::utils::MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpSquaredNorm,_lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_uscalfe_test_bvp_fe_tests_cc:302:7)>,_lf::fe::MeshFunctionFE<double,_double>_>_>_>
  __x;
  double dVar1;
  MeshFunctionReturnType<lf::mesh::utils::MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpSquaredNorm,_lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_uscalfe_test_bvp_fe_tests_cc:304:7)>,_lf::fe::MeshFunctionGradFE<double,_double>_>_>_>
  __x_00;
  int iVar2;
  element_type *this_00;
  element_type *peVar3;
  undefined4 extraout_var;
  type *matrix;
  MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *b;
  element_type *peVar4;
  ostream *poVar5;
  void *this_01;
  undefined4 in_register_00000014;
  Solve<Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  SVar6;
  PredicateTrue local_559;
  MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_uscalfe_test_bvp_fe_tests_cc:304:7)>,_lf::fe::MeshFunctionGradFE<double,_double>_>
  local_558;
  MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpSquaredNorm,_lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_uscalfe_test_bvp_fe_tests_cc:304:7)>,_lf::fe::MeshFunctionGradFE<double,_double>_>_>
  local_518;
  double local_4d0;
  double H1serr;
  MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_uscalfe_test_bvp_fe_tests_cc:302:7)>,_lf::fe::MeshFunctionFE<double,_double>_>
  local_4c0;
  MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpSquaredNorm,_lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_uscalfe_test_bvp_fe_tests_cc:302:7)>,_lf::fe::MeshFunctionFE<double,_double>_>_>
  local_480;
  double local_438;
  double L2err;
  shared_ptr<const_lf::fe::ScalarFESpace<double>_> local_420;
  undefined1 local_410 [8];
  MeshFunctionGradFE<double,_double> mf_grad_solution;
  shared_ptr<const_lf::fe::ScalarFESpace<double>_> local_3e0;
  undefined1 local_3d0 [8];
  MeshFunctionFE<double,_double> mf_solution;
  undefined1 local_3a0 [8];
  VectorXd sol_vec;
  SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> solver;
  type *phi;
  type *A;
  shared_ptr<lf::uscalfe::UniformScalarFESpace<double>_> local_128;
  pair<Eigen::SparseMatrix<double,_0,_int>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_118;
  undefined8 local_c0;
  DofHandler *dofh;
  shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>_> fe_space;
  undefined1 local_98 [8];
  shared_ptr<const_lf::mesh::Mesh> mesh_p;
  int l;
  size_type L;
  MeshHierarchy *multi_mesh;
  shared_ptr<lf::mesh::Mesh> local_68;
  undefined1 local_58 [8];
  shared_ptr<lf::refinement::MeshHierarchy> multi_mesh_p;
  double scal_local;
  int meshsel_local;
  MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_uscalfe_test_bvp_fe_tests_cc:304:7)>
  *sol_grad_local;
  MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_uscalfe_test_bvp_fe_tests_cc:302:7)>
  *solution_local;
  shared_ptr<const_lf::uscalfe::test::SecondOrderEllipticBVP<double>_> *bvp_p_local;
  int reflevels_local;
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *errnorms;
  
  multi_mesh_p.super___shared_ptr<lf::refinement::MeshHierarchy,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._7_1_ = 0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::vector
            (__return_storage_ptr__);
  lf::mesh::test_utils::GenerateHybrid2DTestMesh((test_utils *)&local_68,(int)sol_grad,scal);
  refinement::GenerateMeshHierarchyByUniformRefinemnt
            ((refinement *)local_58,&local_68,(size_type)this,rp_regular);
  std::shared_ptr<lf::mesh::Mesh>::~shared_ptr(&local_68);
  this_00 = std::
            __shared_ptr_access<lf::refinement::MeshHierarchy,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator*((__shared_ptr_access<lf::refinement::MeshHierarchy,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_58);
  refinement::MeshHierarchy::PrintInfo(this_00,(ostream *)&std::cout,0);
  mesh_p.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _4_4_ = refinement::MeshHierarchy::NumLevels(this_00);
  for (mesh_p.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       ._0_4_ = 0;
      (uint)mesh_p.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi <
      mesh_p.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
      _4_4_; mesh_p.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ._M_pi._0_4_ = (uint)mesh_p.
                                  super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount._M_pi + 1) {
    refinement::MeshHierarchy::getMesh
              ((MeshHierarchy *)
               &fe_space.
                super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount,(size_type)this_00);
    __r = &fe_space.
           super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount;
    std::shared_ptr<lf::mesh::Mesh_const>::shared_ptr<lf::mesh::Mesh,void>
              ((shared_ptr<lf::mesh::Mesh_const> *)local_98,(shared_ptr<lf::mesh::Mesh> *)__r);
    std::shared_ptr<lf::mesh::Mesh>::~shared_ptr((shared_ptr<lf::mesh::Mesh> *)__r);
    std::make_shared<lf::uscalfe::FeSpaceLagrangeO1<double>,std::shared_ptr<lf::mesh::Mesh_const>&>
              ((shared_ptr<const_lf::mesh::Mesh> *)&dofh);
    peVar3 = std::
             __shared_ptr_access<lf::uscalfe::FeSpaceLagrangeO1<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<lf::uscalfe::FeSpaceLagrangeO1<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&dofh);
    iVar2 = (*(peVar3->super_UniformScalarFESpace<double>).super_ScalarFESpace<double>.
              _vptr_ScalarFESpace[1])();
    local_c0 = CONCAT44(extraout_var,iVar2);
    std::shared_ptr<lf::uscalfe::UniformScalarFESpace<double>>::
    shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>,void>
              ((shared_ptr<lf::uscalfe::UniformScalarFESpace<double>> *)&local_128,
               (shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>_> *)&dofh);
    std::shared_ptr<const_lf::uscalfe::test::SecondOrderEllipticBVP<double>_>::shared_ptr
              ((shared_ptr<const_lf::uscalfe::test::SecondOrderEllipticBVP<double>_> *)&A,
               (shared_ptr<const_lf::uscalfe::test::SecondOrderEllipticBVP<double>_> *)
               CONCAT44(in_register_00000014,reflevels));
    SecOrdEllBVPLagrFELinSys<double>
              (&local_118,&local_128,
               (shared_ptr<const_lf::uscalfe::test::SecondOrderEllipticBVP<double>_> *)&A);
    std::shared_ptr<const_lf::uscalfe::test::SecondOrderEllipticBVP<double>_>::~shared_ptr
              ((shared_ptr<const_lf::uscalfe::test::SecondOrderEllipticBVP<double>_> *)&A);
    std::shared_ptr<lf::uscalfe::UniformScalarFESpace<double>_>::~shared_ptr(&local_128);
    matrix = std::get<0ul,Eigen::SparseMatrix<double,0,int>,Eigen::Matrix<double,_1,1,0,_1,1>>
                       (&local_118);
    b = (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
        std::get<1ul,Eigen::SparseMatrix<double,0,int>,Eigen::Matrix<double,_1,1,0,_1,1>>
                  (&local_118);
    Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>::SparseLU
              ((SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)
               &sol_vec.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows);
    Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>::compute
              ((SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)
               &sol_vec.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows,matrix);
    SVar6 = Eigen::
            SparseSolverBase<Eigen::SparseLU<Eigen::SparseMatrix<double,0,int>,Eigen::COLAMDOrdering<int>>>
            ::solve<Eigen::Matrix<double,_1,1,0,_1,1>>
                      ((SparseSolverBase<Eigen::SparseLU<Eigen::SparseMatrix<double,0,int>,Eigen::COLAMDOrdering<int>>>
                        *)&sol_vec.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                           m_storage.m_rows,b);
    mf_solution.dof_vector_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
    .m_rows = (Index)SVar6.m_dec;
    Eigen::Matrix<double,-1,1,0,-1,1>::
    Matrix<Eigen::Solve<Eigen::SparseLU<Eigen::SparseMatrix<double,0,int>,Eigen::COLAMDOrdering<int>>,Eigen::Matrix<double,_1,1,0,_1,1>>>
              ((Matrix<double,_1,1,0,_1,1> *)local_3a0,
               (EigenBase<Eigen::Solve<Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)&mf_solution.dof_vector_.
                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows);
    std::shared_ptr<lf::fe::ScalarFESpace<double>const>::
    shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>,void>
              ((shared_ptr<lf::fe::ScalarFESpace<double>const> *)&local_3e0,
               (shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>_> *)&dofh);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
              ((Matrix<double,__1,_1,_0,__1,_1> *)
               &mf_grad_solution.dof_vector_.
                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
               (Matrix<double,__1,_1,_0,__1,_1> *)local_3a0);
    lf::fe::MeshFunctionFE<double,_double>::MeshFunctionFE
              ((MeshFunctionFE<double,_double> *)local_3d0,&local_3e0,
               (Matrix<double,__1,_1,_0,__1,_1> *)
               &mf_grad_solution.dof_vector_.
                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix
              ((Matrix<double,__1,_1,_0,__1,_1> *)
               &mf_grad_solution.dof_vector_.
                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows);
    std::shared_ptr<const_lf::fe::ScalarFESpace<double>_>::~shared_ptr(&local_3e0);
    std::shared_ptr<lf::fe::ScalarFESpace<double>const>::
    shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>,void>
              ((shared_ptr<lf::fe::ScalarFESpace<double>const> *)&local_420,
               (shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>_> *)&dofh);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
              ((Matrix<double,__1,_1,_0,__1,_1> *)&L2err,
               (Matrix<double,__1,_1,_0,__1,_1> *)local_3a0);
    lf::fe::MeshFunctionGradFE<double,_double>::MeshFunctionGradFE
              ((MeshFunctionGradFE<double,_double> *)local_410,&local_420,
               (Matrix<double,__1,_1,_0,__1,_1> *)&L2err);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)&L2err);
    std::shared_ptr<const_lf::fe::ScalarFESpace<double>_>::~shared_ptr(&local_420);
    peVar4 = std::
             __shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator*((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_98);
    lf::mesh::utils::
    operator-<lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_uscalfe_test_bvp_fe_tests_cc:302:7)>,_lf::fe::MeshFunctionFE<double,_double>_>
              (&local_4c0,
               (MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_uscalfe_test_bvp_fe_tests_cc:302:7)>
                *)bvp_p,(MeshFunctionFE<double,_double> *)local_3d0);
    lf::mesh::utils::
    squaredNorm<lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_uscalfe_test_bvp_fe_tests_cc:302:7)>,_lf::fe::MeshFunctionFE<double,_double>_>_>
              (&local_480,&local_4c0);
    __x = lf::fe::
          IntegrateMeshFunction<lf::mesh::utils::MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpSquaredNorm,_lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_uscalfe_test_bvp_fe_tests_cc:302:7)>,_lf::fe::MeshFunctionFE<double,_double>_>_>,_lf::base::PredicateTrue>
                    (peVar4,&local_480,2,(PredicateTrue *)((long)&H1serr + 7),0);
    dVar1 = sqrt(__x);
    lf::mesh::utils::
    MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpSquaredNorm,_lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/test/bvp_fe_tests.cc:302:7)>,_lf::fe::MeshFunctionFE<double,_double>_>_>
    ::~MeshFunctionUnary(&local_480);
    lf::mesh::utils::
    MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/test/bvp_fe_tests.cc:302:7)>,_lf::fe::MeshFunctionFE<double,_double>_>
    ::~MeshFunctionBinary(&local_4c0);
    local_438 = dVar1;
    peVar4 = std::
             __shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator*((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_98);
    lf::mesh::utils::
    operator-<lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_uscalfe_test_bvp_fe_tests_cc:304:7)>,_lf::fe::MeshFunctionGradFE<double,_double>_>
              (&local_558,
               (MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_uscalfe_test_bvp_fe_tests_cc:304:7)>
                *)solution,(MeshFunctionGradFE<double,_double> *)local_410);
    lf::mesh::utils::
    squaredNorm<lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_uscalfe_test_bvp_fe_tests_cc:304:7)>,_lf::fe::MeshFunctionGradFE<double,_double>_>_>
              (&local_518,&local_558);
    __x_00 = lf::fe::
             IntegrateMeshFunction<lf::mesh::utils::MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpSquaredNorm,_lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_uscalfe_test_bvp_fe_tests_cc:304:7)>,_lf::fe::MeshFunctionGradFE<double,_double>_>_>,_lf::base::PredicateTrue>
                       (peVar4,&local_518,2,&local_559,0);
    dVar1 = sqrt(__x_00);
    lf::mesh::utils::
    MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpSquaredNorm,_lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/test/bvp_fe_tests.cc:304:7)>,_lf::fe::MeshFunctionGradFE<double,_double>_>_>
    ::~MeshFunctionUnary(&local_518);
    lf::mesh::utils::
    MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/test/bvp_fe_tests.cc:304:7)>,_lf::fe::MeshFunctionGradFE<double,_double>_>
    ::~MeshFunctionBinary(&local_558);
    local_4d0 = dVar1;
    poVar5 = std::operator<<((ostream *)&std::cout,"Level ");
    poVar5 = (ostream *)
             std::ostream::operator<<
                       (poVar5,(uint)mesh_p.
                                     super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount._M_pi);
    poVar5 = std::operator<<(poVar5," : errors, L2 = ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_438);
    poVar5 = std::operator<<(poVar5,", H1 = ");
    this_01 = (void *)std::ostream::operator<<(poVar5,local_4d0);
    std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
    std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
    emplace_back<double&,double&>
              ((vector<std::pair<double,double>,std::allocator<std::pair<double,double>>> *)
               __return_storage_ptr__,&local_438,&local_4d0);
    lf::fe::MeshFunctionGradFE<double,_double>::~MeshFunctionGradFE
              ((MeshFunctionGradFE<double,_double> *)local_410);
    lf::fe::MeshFunctionFE<double,_double>::~MeshFunctionFE
              ((MeshFunctionFE<double,_double> *)local_3d0);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_3a0);
    Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>::~SparseLU
              ((SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)
               &sol_vec.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows);
    std::pair<Eigen::SparseMatrix<double,_0,_int>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~pair
              (&local_118);
    std::shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>_>::~shared_ptr
              ((shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>_> *)&dofh);
    std::shared_ptr<const_lf::mesh::Mesh>::~shared_ptr((shared_ptr<const_lf::mesh::Mesh> *)local_98)
    ;
  }
  multi_mesh_p.super___shared_ptr<lf::refinement::MeshHierarchy,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._7_1_ = 1;
  std::shared_ptr<lf::refinement::MeshHierarchy>::~shared_ptr
            ((shared_ptr<lf::refinement::MeshHierarchy> *)local_58);
  if ((multi_mesh_p.super___shared_ptr<lf::refinement::MeshHierarchy,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi._7_1_ & 1) == 0) {
    std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::~vector
              (__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::pair<double, double>> TestConvergenceEllBVPFESol(
    int reflevels, std::shared_ptr<const SecondOrderEllipticBVP<double>> bvp_p,
    SOLFUNC solution, SOLGRAD sol_grad, int meshsel = 0,
    double scal = 1.0 / 3) {
  std::vector<std::pair<double, double>> errnorms{};

  // Generate hierarchy of meshes of the unit square
  std::shared_ptr<lf::refinement::MeshHierarchy> multi_mesh_p =
      lf::refinement::GenerateMeshHierarchyByUniformRefinemnt(
          lf::mesh::test_utils::GenerateHybrid2DTestMesh(meshsel, scal),
          reflevels);
  lf::refinement::MeshHierarchy& multi_mesh{*multi_mesh_p};
  multi_mesh.PrintInfo(std::cout);
  // Number of levels
  size_type L = multi_mesh.NumLevels();

  // Do computations on all levels
  for (int l = 0; l < L; ++l) {
    std::shared_ptr<const mesh::Mesh> mesh_p{multi_mesh.getMesh(l)};
    // Set up global FE space; lowest order Lagrangian finite elements
    auto fe_space = std::make_shared<FeSpaceLagrangeO1<double>>(mesh_p);
    const lf::assemble::DofHandler& dofh{fe_space->LocGlobMap()};

    // Compute Galerkin matrix A and right-hand-side vector
    auto [A, phi] = SecOrdEllBVPLagrFELinSys<double>(fe_space, bvp_p);
    // Solve linear system
    Eigen::SparseLU<Eigen::SparseMatrix<double>> solver;
    solver.compute(A);
    Eigen::VectorXd sol_vec = solver.solve(phi);
    // Compute error norms
    lf::fe::MeshFunctionFE<double, double> mf_solution(fe_space, sol_vec);
    lf::fe::MeshFunctionGradFE<double, double> mf_grad_solution(fe_space,
                                                                sol_vec);
    double L2err = std::sqrt(lf::fe::IntegrateMeshFunction(
        *mesh_p, squaredNorm(solution - mf_solution), 2));
    double H1serr = std::sqrt(lf::fe::IntegrateMeshFunction(
        *mesh_p, squaredNorm(sol_grad - mf_grad_solution), 2));
    std::cout << "Level " << l << " : errors, L2 = " << L2err
              << ", H1 = " << H1serr << std::endl;
    errnorms.emplace_back(L2err, H1serr);
  }

  return errnorms;
}